

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help.cpp
# Opt level: O1

bool pstore::command_line::details::has_switches(option *self,options_container *all)

{
  _List_node_base *p_Var1;
  option *poVar2;
  int iVar3;
  
  p_Var1 = (all->
           super__List_base<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  while ((p_Var1 != (_List_node_base *)all &&
         (((poVar2 = (option *)p_Var1[1]._M_next, poVar2 == self ||
           (iVar3 = (*(code *)((_List_node_base *)poVar2->_vptr_option)[5]._M_next)(poVar2),
           (char)iVar3 != '\0')) ||
          (iVar3 = (*(code *)((_List_node_base *)poVar2->_vptr_option)[4]._M_prev)(poVar2),
          (char)iVar3 != '\0'))))) {
    p_Var1 = (((_List_base<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>
                *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
  }
  return p_Var1 != (_List_node_base *)all;
}

Assistant:

bool has_switches (option const * const self,
                                   option::options_container const & all) {
                    return std::any_of (
                        std::begin (all), std::end (all), [self] (option const * const op) {
                            return op != self && !op->is_alias () && !op->is_positional ();
                        });
                }